

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

void SparseKeygenRecurse<Blob<640>,unsigned_int>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<640> *k,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes)

{
  iterator __position;
  uint h;
  uint local_3c;
  pfHash local_38;
  
  if (start < 0x280) {
    local_38 = hash;
    do {
      flipbit(k,0x50,start);
      if (bitsleft == 1 || inclusive) {
        (*local_38)(k,0x50,0,&local_3c);
        __position._M_current =
             (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)hashes,__position,
                     &local_3c);
        }
        else {
          *__position._M_current = local_3c;
          (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      if (1 < bitsleft) {
        SparseKeygenRecurse<Blob<640>,unsigned_int>
                  (local_38,start + 1,bitsleft + -1,inclusive,k,hashes);
      }
      flipbit(k,0x50,start);
      start = start + 1;
    } while (start != 0x280);
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}